

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall
QList<QList<QWidgetItemData>_>::reserve(QList<QList<QWidgetItemData>_> *this,qsizetype asize)

{
  ArrayOptions *pAVar1;
  QList<QWidgetItemData> *pQVar2;
  Data *pDVar3;
  long lVar4;
  Data *pDVar5;
  qsizetype qVar6;
  QList<QWidgetItemData> *data;
  QList<QWidgetItemData> *pQVar7;
  QList<QWidgetItemData> *pQVar8;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QList<QWidgetItemData>_> local_38;
  QArrayData *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->d).d;
  if ((pDVar3 != (Data *)0x0) &&
     (asize <= ((long)((long)(this->d).ptr -
                      ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 3) * 0x5555555555555555 + (pDVar3->super_QArrayData).alloc)) {
    if (((pDVar3->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) goto LAB_005c2a06;
    if ((pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 1)) {
      pAVar1 = &(pDVar3->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      goto LAB_005c2a06;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QList<QWidgetItemData> *)&DAT_aaaaaaaaaaaaaaaa;
  lVar4 = (this->d).size;
  if (asize < lVar4) {
    asize = lVar4;
  }
  local_20 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar7 = (QList<QWidgetItemData> *)QArrayData::allocate(&local_20,0x18,0x10,asize,KeepSize);
  local_38.size = 0;
  lVar4 = (this->d).size;
  if (0 < lVar4) {
    pQVar8 = (this->d).ptr;
    pQVar2 = pQVar8 + lVar4;
    do {
      pDVar5 = (pQVar8->d).d;
      pQVar7[local_38.size].d.d = pDVar5;
      pQVar7[local_38.size].d.ptr = (pQVar8->d).ptr;
      pQVar7[local_38.size].d.size = (pQVar8->d).size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar8 = pQVar8 + 1;
      local_38.size = local_38.size + 1;
    } while (pQVar8 < pQVar2);
  }
  if (local_20 != (QArrayData *)0x0) {
    *(byte *)&(local_20->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(local_20->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  local_38.d = (this->d).d;
  local_38.ptr = (this->d).ptr;
  (this->d).d = (Data *)local_20;
  (this->d).ptr = pQVar7;
  qVar6 = (this->d).size;
  (this->d).size = local_38.size;
  local_38.size = qVar6;
  QArrayDataPointer<QList<QWidgetItemData>_>::~QArrayDataPointer(&local_38);
LAB_005c2a06:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}